

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callFunctionTestSuite.cpp
# Opt level: O1

void __thiscall Test::Test(Test *this)

{
  _Rb_tree_header *p_Var1;
  int local_1c [3];
  
  p_Var1 = &(this->mVisitedMethods)._M_t._M_impl.super__Rb_tree_header;
  (this->mVisitedMethods)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mVisitedMethods)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mVisitedMethods)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mVisitedMethods)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->mVisitedMethods)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1c[2] = 0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  ::_M_emplace_unique<char_const(&)[4],int>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              *)this,(char (*) [4])"foo",local_1c + 2);
  local_1c[1] = 0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  ::_M_emplace_unique<char_const(&)[7],int>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              *)this,(char (*) [7])"getSum",local_1c + 1);
  local_1c[0] = 0;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  ::_M_emplace_unique<char_const(&)[4],int>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
              *)this,(char (*) [4])"max",local_1c);
  return;
}

Assistant:

Test()
  {
    mVisitedMethods.emplace("foo", 0);
    mVisitedMethods.emplace("getSum", 0);
    mVisitedMethods.emplace("max", 0);
  }